

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QPluginParsedMetaData>::reallocateAndGrow
          (QArrayDataPointer<QPluginParsedMetaData> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QPluginParsedMetaData> *old)

{
  QCborValue *pQVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  Data *pDVar5;
  QPluginParsedMetaData *pQVar6;
  bool bVar7;
  long lVar8;
  undefined1 *puVar9;
  QCborValue *other;
  long in_FS_OFFSET;
  QArrayDataPointer<QPluginParsedMetaData> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QPluginParsedMetaData *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  pQVar6 = local_48.ptr;
  if ((n < 1) || (local_48.ptr != (QPluginParsedMetaData *)0x0)) {
    puVar9 = (undefined1 *)local_48.size;
    if (this->size != 0) {
      lVar8 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar7 = true;
      }
      else {
        bVar7 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      other = &this->ptr->data;
      pQVar1 = other + lVar8;
      if ((old != (QArrayDataPointer<QPluginParsedMetaData> *)0x0) || (bVar7)) {
        if ((lVar8 != 0) && (0 < lVar8)) {
          do {
            QCborValue::QCborValue((QCborValue *)(pQVar6 + local_48.size),other);
            other = other + 1;
            local_48.size = local_48.size + 1;
            puVar9 = (undefined1 *)local_48.size;
          } while (other < pQVar1);
        }
      }
      else if ((lVar8 != 0) && (0 < lVar8)) {
        lVar8 = 0;
        do {
          puVar2 = (undefined8 *)((long)&((QCborValue *)&other->n)->n + lVar8);
          *(undefined8 *)((long)&local_48.ptr[local_48.size].data.n + lVar8) = *puVar2;
          uVar4 = puVar2[1];
          puVar2[1] = 0;
          *(undefined8 *)((long)&local_48.ptr[local_48.size].data.container + lVar8) = uVar4;
          uVar3 = *(undefined4 *)(puVar2 + 2);
          *(undefined4 *)(puVar2 + 2) = 0x117;
          *(undefined4 *)((long)&local_48.ptr[local_48.size].data.t + lVar8) = uVar3;
          puVar9 = puVar9 + 1;
          lVar8 = lVar8 + 0x18;
        } while ((QCborValue *)(puVar2 + 3) < pQVar1);
      }
    }
    local_48.size = (qsizetype)puVar9;
    pDVar5 = this->d;
    pQVar6 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    puVar9 = (undefined1 *)this->size;
    this->size = local_48.size;
    local_48.d = pDVar5;
    local_48.ptr = pQVar6;
    local_48.size = (qsizetype)puVar9;
    if (old != (QArrayDataPointer<QPluginParsedMetaData> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = pDVar5;
      old->ptr = pQVar6;
      local_48.size = old->size;
      old->size = (qsizetype)puVar9;
    }
    ~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    qBadAlloc();
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }